

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_test.cc
# Opt level: O2

void __thiscall
wiener_highbd::WienerTestHighbd_ExtremeValues_Test::TestBody
          (WienerTestHighbd_ExtremeValues_Test *this)

{
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,7,AOM_BITS_8);
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,5,AOM_BITS_8);
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,7,AOM_BITS_10);
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,5,AOM_BITS_10);
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,7,AOM_BITS_12);
  WienerTestHighbd::RunWienerTest_ExtremeValues(&this->super_WienerTestHighbd,5,AOM_BITS_12);
  return;
}

Assistant:

TEST_P(WienerTestHighbd, ExtremeValues) {
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_8);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_8);
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_10);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_10);
  RunWienerTest_ExtremeValues(WIENER_WIN, AOM_BITS_12);
  RunWienerTest_ExtremeValues(WIENER_WIN_CHROMA, AOM_BITS_12);
}